

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::add_hl_de(CPU *this)

{
  byte bVar1;
  Registers *pRVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  pRVar2 = this->regs;
  bVar3 = pRVar2->d;
  bVar4 = pRVar2->f & 0x80;
  pRVar2->f = bVar4;
  if ((0xff < (uint)pRVar2->l + (uint)pRVar2->e) && (bVar3 = bVar3 + 1, bVar3 == 0)) {
    bVar4 = bVar4 | 0x30;
    pRVar2->f = bVar4;
    bVar3 = 0;
  }
  pRVar2->l = pRVar2->e + pRVar2->l;
  bVar1 = pRVar2->h;
  uVar6 = (uint)bVar1 + (uint)bVar3;
  uVar7 = (bVar3 & 0xf) + (bVar1 & 0xf);
  if ((0xff < uVar6) || (0xf < uVar7)) {
    bVar5 = bVar4 | 0x20;
    if (uVar7 < 0x10) {
      bVar5 = bVar4;
    }
    bVar4 = bVar5 | 0x10;
    if (uVar6 < 0x100) {
      bVar4 = bVar5;
    }
    pRVar2->f = bVar4;
  }
  pRVar2->h = bVar3 + bVar1;
  return 2;
}

Assistant:

int CPU::add_hl_de() {
    add_hl_r16(regs.d, regs.e);
    return 2;
}